

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void google::protobuf::internal::PackedFieldHelper<8>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  bool bVar1;
  bool *pbVar2;
  uint8 *ptr;
  RepeatedField<bool> *array;
  int index;
  undefined4 local_30;
  uint32 local_2c;
  
  if (*field != 0) {
    local_2c = md->tag;
    PrimitiveTypeHelper<13>::Serialize(&local_2c,output);
    local_30 = *(undefined4 *)((long)field + 0x10);
    PrimitiveTypeHelper<13>::Serialize(&local_30,output);
    if (0 < *field) {
      index = 0;
      do {
        pbVar2 = RepeatedField<bool>::Get((RepeatedField<bool> *)field,index);
        bVar1 = *pbVar2;
        ptr = output->cur_;
        if ((output->impl_).end_ <= ptr) {
          ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
        }
        *ptr = bVar1;
        output->cur_ = ptr + 1;
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}